

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::LoopSetInst::Exec
          (LoopSetInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  uint64 *puVar1;
  Char CVar2;
  int iVar3;
  CharCount CVar4;
  Type TVar5;
  PageAllocation *pPVar6;
  size_t sVar7;
  uint8 *puVar8;
  Program *pPVar9;
  uint8 *puVar10;
  code *pcVar11;
  bool bVar12;
  uint uVar13;
  uint uVar14;
  undefined4 *puVar15;
  List<unsigned_int,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer> *this_00;
  LoopInfo *pLVar16;
  ArenaAllocator *alloc;
  
  iVar3 = (this->super_BeginLoopBasicsMixin).loopId;
  if (((long)iVar3 < 0) || (((matcher->program).ptr)->numLoops <= iVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar15 = 1;
    bVar12 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                        ,0x77b,"(loopId >= 0 && loopId < program->numLoops)",
                        "loopId >= 0 && loopId < program->numLoops");
    if (!bVar12) goto LAB_00f0d312;
    *puVar15 = 0;
  }
  pLVar16 = (matcher->loopInfos).ptr + iVar3;
  if ((this->super_BeginLoopBasicsMixin).hasOuterLoops == true) {
    if ((contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
        super_ContinuousPageStack<1UL>.bufferSize -
        (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
        super_ContinuousPageStack<1UL>.nextTop < 0x28) {
      ContinuousPageStack<1UL>::Resize((ContinuousPageStack<1UL> *)contStack,0x28);
    }
    if ((contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
        super_ContinuousPageStack<1UL>.bufferSize == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar12 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                          ,199,"(bufferSize)","bufferSize");
      if (!bVar12) goto LAB_00f0d312;
      *puVar15 = 0;
    }
    pPVar6 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
             super_ContinuousPageStack<1UL>.pageAllocation;
    sVar7 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
            super_ContinuousPageStack<1UL>.nextTop;
    (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
    super_ContinuousPageStack<1UL>.nextTop = sVar7 + 0x28;
    *(size_t *)((long)&pPVar6[1].pageCount + sVar7) =
         (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
         topElementSize;
    (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).topElementSize
         = 0x28;
    iVar3 = (this->super_BeginLoopBasicsMixin).loopId;
    *(undefined1 *)((long)&pPVar6[2].pageCount + sVar7) = 1;
    *(undefined ***)((long)&pPVar6[1].segment + sVar7) = &PTR_Print_01559968;
    *(int *)((long)&pPVar6[2].pageCount + sVar7 + 4) = iVar3;
    *(CharCount *)((long)&pPVar6[2].segment + sVar7) = pLVar16->number;
    *(CharCount *)((long)&pPVar6[2].segment + sVar7 + 4) = pLVar16->startInputOffset;
    *(undefined8 *)((long)&pPVar6[3].pageCount + sVar7) = 0;
    if (pLVar16->offsetsOfFollowFirst !=
        (List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
        0x0) {
      alloc = &((((((matcher->pattern).ptr)->library).ptr)->super_JavascriptLibraryBase).
                scriptContext.ptr)->regexAllocator;
      this_00 = (List<unsigned_int,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
                 *)new<Memory::ArenaAllocator>(0x30,alloc,0x366bee);
      *(undefined8 *)(this_00 + 8) = 0;
      *(undefined4 *)(this_00 + 0x10) = 0;
      *(ArenaAllocator **)(this_00 + 0x18) = alloc;
      *(undefined ***)this_00 = &PTR_IsReadOnly_014ea098;
      *(undefined8 *)(this_00 + 0x20) = 0x400000000;
      *(List<unsigned_int,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer> **)
       ((long)&pPVar6[3].pageCount + sVar7) = this_00;
      JsUtil::List<unsigned_int,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>::
      Copy<JsUtil::List<unsigned_int,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>>
                (this_00,pLVar16->offsetsOfFollowFirst);
    }
    Matcher::PushStats(matcher,contStack,input);
  }
  pLVar16->startInputOffset = *inputOffset;
  CVar4 = *inputOffset;
  uVar13 = (this->super_BeginLoopBasicsMixin).repeats.upper;
  uVar14 = uVar13 + CVar4;
  if (inputLength - CVar4 <= uVar13) {
    uVar14 = inputLength;
  }
  if (matcher->stats != (Type)0x0) {
    puVar1 = &matcher->stats->numCompares;
    *puVar1 = *puVar1 + 1;
  }
  uVar13 = *inputOffset;
  if (uVar13 < uVar14) {
    do {
      CVar2 = input[uVar13];
      if ((ushort)CVar2 < 0x100) {
        bVar12 = ((this->super_SetMixin<false>).set.direct.vec[(ushort)CVar2 >> 5] >>
                  ((ushort)CVar2 & 0x1f) & 1) != 0;
      }
      else {
        if ((this->super_SetMixin<false>).set.root == (CharSetNode *)0x0) break;
        bVar12 = RuntimeCharSet<char16_t>::Get_helper
                           (&(this->super_SetMixin<false>).set,(uint)(ushort)CVar2);
      }
      if (bVar12 == false) break;
      if (matcher->stats != (Type)0x0) {
        puVar1 = &matcher->stats->numCompares;
        *puVar1 = *puVar1 + 1;
      }
      uVar13 = *inputOffset + 1;
      *inputOffset = uVar13;
    } while (uVar13 < uVar14);
  }
  uVar14 = *inputOffset - CVar4;
  pLVar16->number = uVar14;
  uVar13 = (this->super_BeginLoopBasicsMixin).repeats.lower;
  if (uVar14 < uVar13) {
    bVar12 = Matcher::Fail(matcher,input,inputOffset,instPointer,contStack,assertionStack,qcTicks);
  }
  else {
    if (uVar13 < uVar14) {
      if ((LoopSetInst *)*instPointer != this) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                            ,0xd75,"(instPointer == (uint8*)this)","instPointer == (uint8*)this");
        if (!bVar12) goto LAB_00f0d312;
        *puVar15 = 0;
      }
      if ((contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
          super_ContinuousPageStack<1UL>.bufferSize -
          (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
          super_ContinuousPageStack<1UL>.nextTop < 0x18) {
        ContinuousPageStack<1UL>::Resize((ContinuousPageStack<1UL> *)contStack,0x18);
      }
      if ((contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
          super_ContinuousPageStack<1UL>.bufferSize == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                            ,199,"(bufferSize)","bufferSize");
        if (!bVar12) goto LAB_00f0d312;
        *puVar15 = 0;
      }
      pPVar6 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
               super_ContinuousPageStack<1UL>.pageAllocation;
      sVar7 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
              super_ContinuousPageStack<1UL>.nextTop;
      (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
      super_ContinuousPageStack<1UL>.nextTop = sVar7 + 0x18;
      *(size_t *)((long)&pPVar6[1].pageCount + sVar7) =
           (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
           topElementSize;
      (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
      topElementSize = 0x18;
      puVar8 = *instPointer;
      pPVar9 = (matcher->program).ptr;
      puVar10 = *(uint8 **)&pPVar9->rep;
      if ((puVar8 < puVar10) || (puVar10 + (pPVar9->rep).insts.instsLen <= puVar8)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                            ,0x767,
                            "(inst >= program->rep.insts.insts && inst < program->rep.insts.insts + program->rep.insts.instsLen)"
                            ,
                            "inst >= program->rep.insts.insts && inst < program->rep.insts.insts + program->rep.insts.instsLen"
                           );
        if (!bVar12) {
LAB_00f0d312:
          pcVar11 = (code *)invalidInstructionException();
          (*pcVar11)();
        }
        *puVar15 = 0;
      }
      TVar5 = (((matcher->program).ptr)->rep).boiLiteral2.literal;
      *(undefined1 *)((long)&pPVar6[2].pageCount + sVar7) = 8;
      *(undefined ***)((long)&pPVar6[1].segment + sVar7) = &PTR_Print_015598d8;
      *(Type *)((long)&pPVar6[2].pageCount + sVar7 + 4) = (int)puVar8 - TVar5;
      Matcher::PushStats(matcher,contStack,input);
    }
    *instPointer = *instPointer + 0x36;
    bVar12 = false;
  }
  return bVar12;
}

Assistant:

inline bool LoopSetInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(loopId);

        // If loop is contained in an outer loop, continuation stack may already have a RewindLoopFixed entry for
        // this loop. We must make sure it's state is preserved on backtrack.
        if (hasOuterLoops)
        {
            PUSH(contStack, RestoreLoopCont, loopId, *loopInfo, matcher);
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
        }

        // startInputOffset will stay here for all iterations, and we'll use number of length to figure out
        // where in the input to rewind to
        loopInfo->startInputOffset = inputOffset;

        // Consume as many elements of set as possible
        const RuntimeCharSet<Char>& matchSet = this->set;
        const CharCount loopMatchStart = inputOffset;
        const CharCountOrFlag repeatsUpper = repeats.upper;
        const CharCount inputEndOffset =
            static_cast<CharCount>(repeatsUpper) >= inputLength - inputOffset
                ? inputLength
                : inputOffset + static_cast<CharCount>(repeatsUpper);
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        while (inputOffset < inputEndOffset && matchSet.Get(input[inputOffset]))
        {
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.CompStats();
#endif
            inputOffset++;
        }

        loopInfo->number = inputOffset - loopMatchStart;
        if (loopInfo->number < repeats.lower)
        {
            return matcher.Fail(FAIL_PARAMETERS);
        }
        else if (loopInfo->number > repeats.lower)
        {
            // CHOICEPOINT: If follow fails, try consuming one fewer characters
            Assert(instPointer == (uint8*)this);
            PUSH(contStack, RewindLoopSetCont, matcher.InstPointerToLabel(instPointer));
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
        }
        // else: failure of follow signals failure of entire loop

        // Continue with follow
        instPointer += sizeof(*this);
        return false;
    }